

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.c
# Opt level: O2

void process_static_url(HttpRequest *req,HttpResponse *resp)

{
  int __fd;
  api_url *paVar1;
  ssize_t sVar2;
  char buffer [10000];
  char acStack_2728 [10000];
  
  if (req->method == GET) {
    paVar1 = api_funcs_get(req->url);
    if (paVar1 == (api_url *)0x0) {
      resp->status_code = 0x194;
      builtin_strncpy(resp->data,"<html><h4>404 not found</h4></html>",0x24);
    }
    else {
      __fd = open(paVar1->path,0);
      if (__fd == -1) {
        resp->status_code = 500;
        builtin_strncpy(resp->data,"<html><h4>500 server internal error</h4></html>",0x30);
      }
      else {
        sVar2 = read(__fd,acStack_2728,10000);
        acStack_2728[(int)sVar2] = '\0';
        strcpy(resp->data,acStack_2728);
        close(__fd);
        resp->status_code = 200;
      }
    }
  }
  else {
    resp->status_code = 400;
    builtin_strncpy(resp->data,"<html><h4>400 bad request</h4></html>",0x26);
  }
  return;
}

Assistant:

void process_static_url(HttpRequest *req, HttpResponse *resp) {

    if (req->method != GET) {
        BAD_RESPONSE(resp);
        return;
    }

    api_url *api_func = api_funcs_get(req->url);

    if (api_func == NULL) {
        NOT_FOUND_RESPONSE(resp);
        return;
    }

    int file_fd = open(api_func->path, O_RDONLY);
    if (file_fd == -1) {
        INTERNAL_ERROR_RESPONSE(resp);
        return;
    }

    char buffer[DATA_LENGTH];
    int st = read(file_fd, buffer, DATA_LENGTH);
    buffer[st] = '\0';
    strcpy(resp->data, buffer);
    close(file_fd);
    SUCCESS_RESPONSE(resp);
}